

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O2

CURLcode Curl_pp_readresp(Curl_easy *data,curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  dynbuf *s;
  size_t *psVar1;
  _Bool _Var2;
  CURLcode CVar3;
  size_t sVar4;
  char *ptr;
  void *pvVar5;
  uint *puVar6;
  ulong size_00;
  ssize_t gotbytes;
  size_t *local_3d0;
  pingpong *local_3c8;
  connectdata *local_3c0;
  char buffer [900];
  
  local_3c0 = data->conn;
  *code = 0;
  *size = 0;
  if (pp->nfinal != 0) {
    sVar4 = Curl_dyn_len(&pp->recvbuf);
    Curl_dyn_tail(&pp->recvbuf,sVar4 - pp->nfinal);
    pp->nfinal = 0;
  }
  if (pp->overflow == 0) {
    gotbytes = 0;
    CVar3 = Curl_read(data,sockfd,buffer,900,&gotbytes);
    if (CVar3 != CURLE_OK) {
      if (CVar3 == CURLE_AGAIN) {
        return CURLE_OK;
      }
      return CVar3;
    }
    if (gotbytes < 1) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data,"response reading failed (errno: %d)",(ulong)*puVar6);
      return CURLE_RECV_ERROR;
    }
    CVar3 = Curl_dyn_addn(&pp->recvbuf,buffer,gotbytes);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    puVar6 = &(data->req).headerbytecount;
    *puVar6 = *puVar6 + (int)gotbytes;
    pp->nread_resp = pp->nread_resp + gotbytes;
  }
  local_3c8 = (pingpong *)&pp->overflow;
  s = &pp->recvbuf;
  local_3d0 = size;
  do {
    ptr = Curl_dyn_ptr(s);
    sVar4 = Curl_dyn_len(s);
    pvVar5 = memchr(ptr,10,sVar4);
    if (pvVar5 == (void *)0x0) {
LAB_00523eb3:
      local_3c8->nread_resp = 0;
      pp->pending_resp = false;
      return CURLE_OK;
    }
    size_00 = (long)pvVar5 + (1 - (long)ptr);
    Curl_debug(data,CURLINFO_HEADER_IN,ptr,size_00);
    CVar3 = Curl_client_write(data,2,ptr,size_00);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    _Var2 = (*pp->endofresp)(data,local_3c0,ptr,size_00,code);
    if (_Var2) {
      pp->nfinal = size_00;
      sVar4 = Curl_dyn_len(s);
      psVar1 = local_3d0;
      if (size_00 < sVar4) {
        sVar4 = Curl_dyn_len(s);
        sVar4 = sVar4 - size_00;
      }
      else {
        sVar4 = 0;
      }
      pp->overflow = sVar4;
      *psVar1 = pp->nread_resp;
      local_3c8 = pp;
      goto LAB_00523eb3;
    }
    sVar4 = Curl_dyn_len(s);
    if (size_00 < sVar4) {
      sVar4 = Curl_dyn_len(s);
      Curl_dyn_tail(s,sVar4 - size_00);
    }
    else {
      Curl_dyn_reset(s);
    }
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(struct Curl_easy *data,
                          curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  if(pp->nfinal) {
    /* a previous call left this many bytes in the beginning of the buffer as
       that was the final line; now ditch that */
    size_t full = Curl_dyn_len(&pp->recvbuf);

    /* trim off the "final" leading part */
    Curl_dyn_tail(&pp->recvbuf, full -  pp->nfinal);

    pp->nfinal = 0; /* now gone */
  }
  if(!pp->overflow) {
    ssize_t gotbytes = 0;
    char buffer[900];

    result = pingpong_read(data, sockfd, buffer, sizeof(buffer), &gotbytes);
    if(result == CURLE_AGAIN)
      return CURLE_OK;

    if(result)
      return result;

    if(gotbytes <= 0) {
      failf(data, "response reading failed (errno: %d)", SOCKERRNO);
      return CURLE_RECV_ERROR;
    }

    result = Curl_dyn_addn(&pp->recvbuf, buffer, gotbytes);
    if(result)
      return result;

    data->req.headerbytecount += (unsigned int)gotbytes;

    pp->nread_resp += gotbytes;
  }

  do {
    char *line = Curl_dyn_ptr(&pp->recvbuf);
    char *nl = memchr(line, '\n', Curl_dyn_len(&pp->recvbuf));
    if(nl) {
      /* a newline is CRLF in pp-talk, so the CR is ignored as
         the line isn't really terminated until the LF comes */
      size_t length = nl - line + 1;

      /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
      if(!conn->sec_complete)
#endif
        Curl_debug(data, CURLINFO_HEADER_IN, line, length);

      /*
       * Pass all response-lines to the callback function registered for
       * "headers". The response lines can be seen as a kind of headers.
       */
      result = Curl_client_write(data, CLIENTWRITE_INFO, line, length);
      if(result)
        return result;

      if(pp->endofresp(data, conn, line, length, code)) {
        /* When at "end of response", keep the endofresp line first in the
           buffer since it will be accessed outside (by pingpong
           parsers). Store the overflow counter to inform about additional
           data in this buffer after the endofresp line. */
        pp->nfinal = length;
        if(Curl_dyn_len(&pp->recvbuf) > length)
          pp->overflow = Curl_dyn_len(&pp->recvbuf) - length;
        else
          pp->overflow = 0;
        *size = pp->nread_resp; /* size of the response */
        pp->nread_resp = 0; /* restart */
        break;
      }
      if(Curl_dyn_len(&pp->recvbuf) > length)
        /* keep the remaining piece */
        Curl_dyn_tail((&pp->recvbuf), Curl_dyn_len(&pp->recvbuf) - length);
      else
        Curl_dyn_reset(&pp->recvbuf);
    }
    else {
      /* without a newline, there is no overflow */
      pp->overflow = 0;
      break;
    }

  } while(1); /* while there's buffer left to scan */

  pp->pending_resp = FALSE;

  return result;
}